

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndDragDropSource(void)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->DragDropActive & 1U) != 0) {
    if ((GImGui->DragDropSourceFlags & 1U) == 0) {
      EndTooltip();
      PopStyleColor(1);
    }
    if ((pIVar1->DragDropPayload).DataFrameCount == -1) {
      ClearDragDrop();
    }
    return;
  }
  __assert_fail("g.DragDropActive",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x33aa,"void ImGui::EndDragDropSource()");
}

Assistant:

void ImGui::EndDragDropSource()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DragDropActive);

    if (!(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        EndTooltip();
        PopStyleColor();
        //PopStyleVar();
    }

    // Discard the drag if have not called SetDragDropPayload()
    if (g.DragDropPayload.DataFrameCount == -1)
        ClearDragDrop();
}